

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

int png_crc_error(png_structrp png_ptr)

{
  bool bVar1;
  int need_crc;
  png_uint_32 crc;
  png_byte crc_bytes [4];
  png_structrp png_ptr_local;
  
  if ((png_ptr->chunk_name >> 0x1d & 1) == 0) {
    bVar1 = (png_ptr->flags & 0x800) != 0;
  }
  else {
    bVar1 = (png_ptr->flags & 0x300) == 0x300;
  }
  png_ptr->io_state = 0x81;
  _crc = png_ptr;
  png_read_data(png_ptr,(png_bytep)&need_crc,4);
  if (bVar1) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    png_ptr_local._4_4_ =
         (uint)((uint)(byte)need_crc * 0x1000000 + (uint)need_crc._1_1_ * 0x10000 +
                (uint)need_crc._2_1_ * 0x100 + (uint)need_crc._3_1_ != _crc->crc);
  }
  return png_ptr_local._4_4_;
}

Assistant:

int /* PRIVATE */
png_crc_error(png_structrp png_ptr)
{
   png_byte crc_bytes[4];
   png_uint_32 crc;
   int need_crc = 1;

   if (PNG_CHUNK_ANCILLARY(png_ptr->chunk_name) != 0)
   {
      if ((png_ptr->flags & PNG_FLAG_CRC_ANCILLARY_MASK) ==
          (PNG_FLAG_CRC_ANCILLARY_USE | PNG_FLAG_CRC_ANCILLARY_NOWARN))
         need_crc = 0;
   }

   else /* critical */
   {
      if ((png_ptr->flags & PNG_FLAG_CRC_CRITICAL_IGNORE) != 0)
         need_crc = 0;
   }

#ifdef PNG_IO_STATE_SUPPORTED
   png_ptr->io_state = PNG_IO_READING | PNG_IO_CHUNK_CRC;
#endif

   /* The chunk CRC must be serialized in a single I/O call. */
   png_read_data(png_ptr, crc_bytes, 4);

   if (need_crc != 0)
   {
      crc = png_get_uint_32(crc_bytes);
      return ((int)(crc != png_ptr->crc));
   }

   else
      return (0);
}